

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Printer.cxx
# Opt level: O2

void __thiscall Fl_Printer::Fl_Printer(Fl_Printer *this)

{
  Fl_PostScript_File_Device *this_00;
  Fl_PostScript_Graphics_Driver *pFVar1;
  
  (this->super_Fl_Paged_Device).super_Fl_Surface_Device._driver = (Fl_Graphics_Driver *)0x0;
  (this->super_Fl_Paged_Device).x_offset = 0;
  (this->super_Fl_Paged_Device).y_offset = 0;
  (this->super_Fl_Paged_Device).super_Fl_Surface_Device.super_Fl_Device._vptr_Fl_Device =
       (_func_int **)&PTR_class_name_00278c00;
  this_00 = (Fl_PostScript_File_Device *)operator_new(0x18);
  Fl_PostScript_Printer::Fl_PostScript_Printer((Fl_PostScript_Printer *)this_00);
  this->printer = (Fl_PostScript_Printer *)this_00;
  pFVar1 = Fl_PostScript_File_Device::driver(this_00);
  (this->super_Fl_Paged_Device).super_Fl_Surface_Device._driver = &pFVar1->super_Fl_Graphics_Driver;
  return;
}

Assistant:

Fl_Printer::Fl_Printer(void) {
#if defined(WIN32) || defined(__APPLE__)
  printer = new Fl_System_Printer();
#else
  printer = new Fl_PostScript_Printer();
#endif
  Fl_Surface_Device::driver(printer->driver());
}